

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

void xercesc_4_0::XMLString::replaceWS(XMLCh *toConvert,MemoryManager *param_2)

{
  XMLCh XVar1;
  
  if ((toConvert != (XMLCh *)0x0) && (XVar1 = *toConvert, XVar1 != L'\0')) {
    do {
      if (((ushort)XVar1 - 9 < 2) || (XVar1 == L'\r')) {
        *toConvert = L' ';
      }
      else if (XVar1 == L'\0') {
        return;
      }
      XVar1 = toConvert[1];
      toConvert = toConvert + 1;
    } while( true );
  }
  return;
}

Assistant:

void XMLString::replaceWS(XMLCh* toConvert, MemoryManager* const)
{
    // If no string, then its a OK
    if (( !toConvert ) || ( !*toConvert ))
        return;

    XMLCh* cursorPtr = toConvert;
    while ( *cursorPtr )
    {
        if ( ( *cursorPtr == chCR) ||
             ( *cursorPtr == chLF) ||
             ( *cursorPtr == chHTab))
            *cursorPtr = chSpace;

        cursorPtr++;
    }
}